

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLCellLinOp::applyBC
          (MLCellLinOp *this,int amrlev,int mglev,MultiFab *in,BCMode bc_mode,StateMode param_5,
          MLMGBndry *bndry,bool skip_fillboundary)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  int *piVar31;
  ulong uVar32;
  int iVar33;
  int *piVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  Periodicity PVar41;
  IntVect hi;
  IntVect low;
  MFItInfo mfi_info;
  MFIter mfi;
  FArrayBox foofab;
  long local_440;
  Array4<double> local_438;
  long local_3f8;
  long local_3f0;
  int local_3e4;
  int local_3e0;
  BCMode local_3dc;
  int *local_3d8;
  int *local_3d0;
  long local_3c8;
  int local_3bc;
  int *local_3b8;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  Array4<const_int> local_3a0;
  Array4<const_int> local_360;
  ulong local_320;
  ulong local_318;
  ulong local_310;
  ulong local_308;
  ulong local_300;
  ulong local_2f8;
  ulong local_2f0;
  double local_2e8 [8];
  long local_2a8;
  long local_2a0;
  ulong local_298;
  ulong local_290;
  long local_288;
  long local_280;
  int local_278;
  uint local_274;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  ulong local_260;
  ulong local_258;
  Array4<const_double> local_250;
  FabArray<amrex::FArrayBox> *local_210;
  long local_208;
  int *local_200;
  uint local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  Array4<const_double> local_1e0;
  long local_1a0;
  ulong local_198;
  long local_190;
  ulong local_188;
  long local_180;
  long local_178;
  undefined1 local_170 [16];
  double local_160;
  double local_158;
  double local_150;
  FabSet *local_148;
  undefined1 local_140 [20];
  uint local_12c;
  IndexType local_128;
  MFItInfo local_124;
  long *local_110;
  long *local_108;
  long local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  MFIter local_d8;
  BaseFab<double> local_78;
  
  local_3dc = bc_mode;
  local_210 = &in->super_FabArray<amrex::FArrayBox>;
  uVar16 = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  iVar17 = (*(this->super_MLLinOp)._vptr_MLLinOp[0x45])(this);
  local_3bc = CONCAT31(local_3bc._1_3_,(char)iVar17);
  iVar17 = (*(this->super_MLLinOp)._vptr_MLLinOp[0x46])(this);
  local_3a4 = CONCAT31(local_3a4._1_3_,(char)iVar17);
  lVar30 = (long)mglev;
  if (!skip_fillboundary) {
    PVar41 = Geometry::periodicity
                       ((Geometry *)
                        (lVar30 * 200 +
                        *(long *)&(this->super_MLLinOp).m_geom.
                                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                        ));
    local_d8.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = PVar41.period.vect._0_8_;
    local_d8.fabArray._0_4_ = PVar41.period.vect[2];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (local_210,0,uVar16,(Periodicity *)&local_d8,(bool)(byte)local_3bc);
  }
  lVar19 = *(long *)&(this->super_MLLinOp).m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar27 = lVar30 * 200;
  local_150 = *(double *)(lVar19 + 0x38 + lVar27);
  local_158 = *(double *)(lVar19 + 0x40 + lVar27);
  local_160 = *(double *)(lVar19 + 0x48 + lVar27);
  local_100 = lVar30 * 0x900 +
              *(long *)&(this->m_maskvals).
                        super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[amrlev].
                        super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
  ;
  local_1f8 = (this->super_MLLinOp).maxorder;
  local_1a0 = *(long *)(*(long *)&(this->m_bcondloc).
                                  super_vector<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[amrlev].
                                  super_vector<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                                  .
                                  super__Vector_base<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>,_std::allocator<std::unique_ptr<amrex::MLCellLinOp::BndryCondLoc,_std::default_delete<amrex::MLCellLinOp::BndryCondLoc>_>_>_>
                       + lVar30 * 8);
  local_d8.tile_size.vect[0] = 0;
  local_d8.tile_size.vect[1] = 0;
  local_d8.tile_size.vect[2] = 0;
  local_d8.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
       (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>)
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x0;
  local_d8.fabArray._0_4_ = 0;
  local_d8.fabArray._4_4_ = 0;
  local_274 = uVar16;
  FArrayBox::FArrayBox((FArrayBox *)&local_78,(Box *)&local_d8,uVar16,true,false,(Arena *)0x0);
  local_170._8_8_ = local_78.dptr;
  local_278 = local_78.nvar;
  local_208 = (long)local_78.domain.smallend.vect[2];
  local_124.do_tiling = false;
  local_124.num_streams = Gpu::Device::max_gpu_streams;
  local_124.tilesize.vect[0] = 0;
  local_124.tilesize.vect[1] = 0;
  local_124.tilesize.vect[2] = 0;
  local_124.dynamic = true;
  local_124.device_sync = true;
  if (((byte)local_3bc | (byte)local_3a4) == 1) {
    local_f8 = (ulong)(uint)(this->super_MLLinOp).info.hidden_direction;
    MFIter::MFIter(&local_d8,&local_210->super_FabArrayBase,&local_124);
    if (local_d8.currentIndex < local_d8.endIndex) {
      local_180 = (long)local_78.domain.bigend.vect[2] + 1;
      local_188 = ((long)local_78.domain.bigend.vect[0] - (long)local_78.domain.smallend.vect[0]) +
                  1;
      local_178 = (((long)local_78.domain.bigend.vect[1] + 1) -
                  (long)local_78.domain.smallend.vect[1]) * local_188;
      local_190 = (local_180 - local_208) * local_178;
      local_170._4_4_ = local_78.domain.smallend.vect[1];
      local_170._0_4_ = local_78.domain.smallend.vect[0];
      local_198 = (long)local_78.domain.bigend.vect[0] + 1U & 0xffffffff |
                  (long)local_78.domain.bigend.vect[1] + 1 << 0x20;
      local_148 = (bndry->super_InterpBndryData).super_BndryData.super_BndryRegister.bndry;
      uVar25 = (ulong)local_274;
      local_298 = uVar25;
      do {
        BATransformer::operator()
                  ((Box *)local_140,
                   (BATransformer *)(CONCAT44(local_d8.fabArray._4_4_,(int)local_d8.fabArray) + 8),
                   (Box *)((long)((local_d8.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_d8.currentIndex] * 0x1c +
                          **(long **)(CONCAT44(local_d8.fabArray._4_4_,(int)local_d8.fabArray) +
                                     0x50)));
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_438,local_210,&local_d8);
        piVar34 = &local_d8.currentIndex;
        if (local_d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar34 = ((local_d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_d8.currentIndex;
        }
        local_108 = (long *)((long)*piVar34 * 0x18 + *(long *)(local_1a0 + 0x200));
        piVar34 = &local_d8.currentIndex;
        if (local_d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar34 = ((local_d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_d8.currentIndex;
        }
        local_110 = (long *)((long)*piVar34 * 0x18 + *(long *)(local_1a0 + 0xf0));
        uVar32 = 0;
        do {
          lVar30 = local_100;
          if (uVar32 != local_f8) {
            local_360.jstride._0_4_ = local_140._8_4_;
            local_360.p = (int *)local_140._0_8_;
            local_3a0.jstride._0_4_ = local_12c;
            local_3a0.p = (int *)local_140._12_8_;
            iVar17 = *(int *)((long)&local_360.p + uVar32 * 4) + -1;
            *(int *)((long)&local_360.p + uVar32 * 4) = iVar17;
            iVar11 = (int)local_360.jstride;
            *(int *)((long)&local_3a0.p + uVar32 * 4) = iVar17;
            local_3c8 = (long)(int)local_360.p;
            iVar9 = local_360.p._4_4_;
            lVar23 = (long)local_360.p._4_4_;
            lVar24 = (long)(int)local_360.jstride;
            local_2f0 = (ulong)local_3a0.p & 0xffffffff;
            local_308 = (ulong)local_3a0.p >> 0x20;
            local_318 = (ulong)(uint)local_3a0.jstride;
            local_360.jstride._0_4_ = local_140._8_4_;
            local_360.p = (int *)local_140._0_8_;
            local_3a0.jstride._0_4_ = local_12c;
            local_3a0.p = (int *)local_140._12_8_;
            local_250.p = (double *)(CONCAT44(local_128.itype >> 1,local_128.itype) & 0x100000001);
            local_250.jstride =
                 CONCAT44(local_250.jstride._4_4_,local_128.itype >> 2) & 0xffffffff00000001;
            iVar17 = (~*(uint *)((long)&local_250.p + uVar32 * 4) & 1) +
                     *(int *)((long)&local_3a0.p + uVar32 * 4);
            *(int *)((long)&local_360.p + uVar32 * 4) = iVar17;
            iVar12 = (int)local_360.jstride;
            *(int *)((long)&local_3a0.p + uVar32 * 4) = iVar17;
            local_3f0 = (long)(int)local_360.p;
            iVar10 = local_360.p._4_4_;
            lVar19 = (long)local_360.p._4_4_;
            lVar27 = (long)(int)local_360.jstride;
            local_2f8 = (ulong)local_3a0.p & 0xffffffff;
            local_310 = (ulong)local_3a0.p >> 0x20;
            iVar17 = *(int *)(local_140 + uVar32 * 4 + 0xc);
            iVar1 = *(int *)(local_140 + uVar32 * 4);
            local_320 = (ulong)(uint)local_3a0.jstride;
            FabArray<amrex::Mask>::array<amrex::Mask,_0>
                      (&local_360,(FabArray<amrex::Mask> *)(local_100 + uVar32 * 0x180),&local_d8);
            FabArray<amrex::Mask>::array<amrex::Mask,_0>
                      (&local_3a0,(FabArray<amrex::Mask> *)(lVar30 + uVar32 * 0x180 + 0x480),
                       &local_d8);
            if (bndry == (MLMGBndry *)0x0) {
              local_250.p = (double *)local_170._8_8_;
              local_250.jstride = local_188;
              local_250.kstride = local_178;
              local_250.nstride = local_190;
              local_250.begin.x = local_170._0_4_;
              local_250.begin.y = local_170._4_4_;
              local_250.begin.z = (int)local_208;
              local_250.end.x = (undefined4)local_198;
              local_250.end.y = local_198._4_4_;
              local_250.end.z = (int)local_180;
              local_250.ncomp = local_278;
              local_1e0.p = (double *)local_170._8_8_;
              local_1e0.jstride = local_188;
              local_1e0.kstride = local_178;
              local_1e0.nstride = local_190;
              local_1e0.begin.x = local_170._0_4_;
              local_1e0.begin.y = local_170._4_4_;
              local_1e0.begin.z = (int)local_208;
              local_1e0.end.x = (undefined4)local_198;
              local_1e0.end.y = local_198._4_4_;
              local_1e0.end.z = (int)local_180;
              local_1e0.ncomp = local_278;
            }
            else {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_250,(FabArray<amrex::FArrayBox> *)(local_148 + uVar32),&local_d8);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_1e0,(FabArray<amrex::FArrayBox> *)(local_148 + uVar32 + 3),&local_d8
                        );
            }
            dVar15 = local_150;
            dVar14 = local_158;
            dVar13 = local_160;
            dVar7 = 1.0;
            dVar8 = 1.0;
            if (0 < (int)local_274) {
              local_e0 = *local_110;
              uVar16 = (iVar17 - iVar1) + 2;
              if ((int)local_1f8 < (int)uVar16) {
                uVar16 = local_1f8;
              }
              uVar37 = (ulong)uVar16;
              local_e8 = *local_108;
              local_264 = iVar9 + 1;
              iVar17 = (int)local_3c8;
              local_1e4 = iVar17 + 1;
              local_1e8 = iVar17 + 1;
              local_268 = iVar11 + 1;
              iVar1 = (int)local_2f0;
              local_3bc = iVar1 + 1;
              iVar3 = (int)local_318;
              local_3e0 = iVar3 + 1;
              iVar4 = (int)local_2f8;
              local_3a4 = iVar4 + 1;
              iVar5 = (int)local_308;
              local_3a8 = iVar5 + 1;
              iVar6 = (int)local_310;
              local_3ac = iVar6 + 1;
              local_258 = (ulong)(uint)(local_3bc - iVar17);
              iVar26 = (int)local_3f0;
              local_260 = (ulong)(uint)(local_3a4 - iVar26);
              local_26c = local_3a8 - iVar9;
              local_270 = local_3ac - iVar10;
              iVar33 = (int)local_320;
              local_3e4 = iVar33 + 1;
              local_280 = local_3c8 * 8;
              local_2a0 = local_3c8 * 4;
              local_1ec = iVar10 + -1;
              local_288 = local_3f0 * 8;
              local_2a8 = local_3f0 * 4;
              local_1f0 = iVar26 + -1;
              local_1f4 = iVar12 + -1;
              local_3f8 = 0;
              local_290 = uVar32;
              uVar29 = 0;
              do {
                local_300 = uVar29;
                lVar30 = local_e0 + local_300 * 0x18;
                iVar18 = *(int *)(lVar30 + uVar32 * 4);
                iVar2 = *(int *)(lVar30 + 0xc + uVar32 * 4);
                lVar30 = local_300 * 0x30 + local_e8;
                dVar38 = *(double *)(lVar30 + uVar32 * 8);
                dVar39 = *(double *)(lVar30 + 0x18 + uVar32 * 8);
                local_3b8 = (int *)CONCAT44(local_3b8._4_4_,iVar2);
                iVar35 = (int)local_258;
                if ((int)uVar32 == 1) {
                  if (iVar18 == 0x65) {
                    local_2e8[4] = -dVar38 * dVar14;
                    local_2e8[5] = 0.5;
                    local_2e8[6] = 1.5;
                    local_2e8[7] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar16) {
                      uVar25 = 0;
                      do {
                        uVar32 = 0;
                        dVar38 = dVar7;
                        dVar40 = dVar8;
                        do {
                          if (uVar25 != uVar32) {
                            dVar38 = dVar38 * (-0.5 - local_2e8[uVar32 + 4]);
                            dVar40 = dVar40 * (local_2e8[uVar25 + 4] - local_2e8[uVar32 + 4]);
                          }
                          uVar32 = uVar32 + 1;
                        } while (uVar37 != uVar32);
                        local_2e8[uVar25] = dVar38 / dVar40;
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar37);
                    }
                    uVar32 = local_290;
                    uVar25 = local_298;
                    if (iVar11 <= iVar3) {
                      local_3d0 = (int *)(long)local_360.begin.z;
                      local_3d8 = (int *)local_360.kstride;
                      lVar30 = lVar24;
                      do {
                        if (iVar17 <= iVar1) {
                          lVar21 = (lVar30 - local_438.begin.z) * local_438.kstride;
                          lVar20 = local_438.nstride * local_300;
                          lVar28 = (lVar23 - local_438.begin.y) * local_438.jstride;
                          lVar36 = local_3c8;
                          do {
                            if (0 < local_360.p
                                    [(lVar23 - local_360.begin.y) *
                                     CONCAT44(local_360.jstride._4_4_,(int)local_360.jstride) +
                                     (lVar30 - (long)local_3d0) * local_360.kstride +
                                     (lVar36 - local_360.begin.x)]) {
                              dVar38 = 0.0;
                              if (1 < (int)uVar16) {
                                uVar29 = 1;
                                do {
                                  dVar38 = dVar38 + local_438.p
                                                    [lVar21 + lVar20 + (lVar36 - local_438.begin.x)
                                                                       + ((iVar9 - local_438.begin.y
                                                                          ) + (int)uVar29) *
                                                                         local_438.jstride] *
                                                    local_2e8[uVar29];
                                  uVar29 = uVar29 + 1;
                                } while (uVar37 != uVar29);
                              }
                              lVar22 = lVar36 - local_438.begin.x;
                              local_438.p[lVar21 + lVar20 + lVar28 + lVar22] = dVar38;
                              if (local_3dc == Inhomogeneous) {
                                local_438.p[lVar21 + lVar20 + lVar28 + lVar22] =
                                     local_250.p
                                     [(lVar23 - local_250.begin.y) * local_250.jstride +
                                      (lVar30 - local_250.begin.z) * local_250.kstride +
                                      local_250.nstride * local_300 + (lVar36 - local_250.begin.x)]
                                     * local_2e8[0] + dVar38;
                              }
                            }
                            lVar36 = lVar36 + 1;
                          } while (local_3bc != (int)lVar36);
                        }
                        lVar30 = lVar30 + 1;
                      } while (local_3e0 != (int)lVar30);
                    }
                  }
                  else if (iVar18 == 0x66) {
                    if (iVar11 <= iVar3) {
                      lVar36 = (long)local_360.p +
                               (lVar24 - local_360.begin.z) * local_360.kstride * 4 +
                               (long)(iVar9 - local_360.begin.y) *
                               CONCAT44(local_360.jstride._4_4_,(int)local_360.jstride) * 4 +
                               (long)local_360.begin.x * -4 + local_2a0;
                      lVar30 = lVar24;
                      do {
                        if (iVar17 <= iVar1) {
                          lVar20 = (lVar30 - local_438.begin.z) * local_438.kstride;
                          lVar28 = 0;
                          do {
                            if (0 < *(int *)(lVar36 + lVar28 * 4)) {
                              *(undefined8 *)
                               ((long)local_438.p +
                               lVar28 * 8 +
                               local_438.jstride * 8 * (long)(iVar9 - local_438.begin.y) +
                               lVar20 * 8 + local_438.nstride * local_3f8 +
                               (long)local_438.begin.x * -8 + local_280) =
                                   *(undefined8 *)
                                    ((long)local_438.p +
                                    lVar28 * 8 +
                                    (long)(local_264 - local_438.begin.y) * local_438.jstride * 8 +
                                    lVar20 * 8 + local_438.nstride * local_3f8 +
                                    (long)local_438.begin.x * -8 + local_280);
                            }
                            lVar28 = lVar28 + 1;
                          } while (iVar35 != (int)lVar28);
                        }
                        lVar30 = lVar30 + 1;
                        lVar36 = lVar36 + local_360.kstride * 4;
                      } while (local_3e0 != (int)lVar30);
                    }
                  }
                  else if ((iVar18 == 0x67) && (iVar11 <= iVar3)) {
                    lVar36 = (long)local_360.p +
                             (lVar24 - local_360.begin.z) * local_360.kstride * 4 +
                             (long)(iVar9 - local_360.begin.y) *
                             CONCAT44(local_360.jstride._4_4_,(int)local_360.jstride) * 4 +
                             (long)local_360.begin.x * -4 + local_2a0;
                    lVar30 = lVar24;
                    do {
                      if (iVar17 <= iVar1) {
                        lVar20 = (lVar30 - local_438.begin.z) * local_438.kstride;
                        lVar28 = 0;
                        do {
                          if (0 < *(int *)(lVar36 + lVar28 * 4)) {
                            *(ulong *)((long)local_438.p +
                                      lVar28 * 8 +
                                      local_438.jstride * 8 * (long)(iVar9 - local_438.begin.y) +
                                      lVar20 * 8 + local_438.nstride * local_3f8 +
                                      (long)local_438.begin.x * -8 + local_280) =
                                 *(ulong *)((long)local_438.p +
                                           lVar28 * 8 +
                                           (long)(local_264 - local_438.begin.y) *
                                           local_438.jstride * 8 + lVar20 * 8 +
                                           local_438.nstride * local_3f8 +
                                           (long)local_438.begin.x * -8 + local_280) ^
                                 0x8000000000000000;
                          }
                          lVar28 = lVar28 + 1;
                        } while (iVar35 != (int)lVar28);
                      }
                      lVar30 = lVar30 + 1;
                      lVar36 = lVar36 + local_360.kstride * 4;
                    } while (local_3e0 != (int)lVar30);
                  }
                  if (iVar2 == 0x65) {
                    local_2e8[4] = -dVar39 * dVar14;
                    local_2e8[5] = 0.5;
                    local_2e8[6] = 1.5;
                    local_2e8[7] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar16) {
                      uVar25 = 0;
                      do {
                        uVar32 = 0;
                        dVar38 = dVar7;
                        dVar39 = dVar8;
                        do {
                          if (uVar25 != uVar32) {
                            dVar38 = dVar38 * (-0.5 - local_2e8[uVar32 + 4]);
                            dVar39 = dVar39 * (local_2e8[uVar25 + 4] - local_2e8[uVar32 + 4]);
                          }
                          uVar32 = uVar32 + 1;
                        } while (uVar37 != uVar32);
                        local_2e8[uVar25] = dVar38 / dVar39;
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar37);
                    }
                    uVar32 = local_290;
                    uVar25 = local_298;
                    if (iVar12 <= iVar33) {
                      local_3b8 = (int *)(long)local_3a0.begin.z;
                      local_3d8 = (int *)local_3a0.kstride;
                      local_3d0 = local_3a0.p +
                                  (lVar19 - local_3a0.begin.y) *
                                  CONCAT44(local_3a0.jstride._4_4_,(uint)local_3a0.jstride);
                      local_440 = lVar27;
                      do {
                        if (iVar26 <= iVar4) {
                          lVar28 = (local_440 - local_438.begin.z) * local_438.kstride;
                          lVar36 = local_438.nstride * local_300;
                          lVar20 = (lVar19 - local_438.begin.y) * local_438.jstride;
                          lVar30 = local_3f0;
                          do {
                            if (0 < local_3d0[(local_440 - (long)local_3b8) * local_3a0.kstride +
                                              (lVar30 - local_3a0.begin.x)]) {
                              dVar38 = 0.0;
                              if (1 < (int)uVar16) {
                                uVar29 = 1;
                                iVar18 = local_1ec - local_438.begin.y;
                                do {
                                  dVar38 = dVar38 + local_438.p
                                                    [lVar28 + lVar36 + (lVar30 - local_438.begin.x)
                                                                       + local_438.jstride * iVar18]
                                                    * local_2e8[uVar29];
                                  uVar29 = uVar29 + 1;
                                  iVar18 = iVar18 + -1;
                                } while (uVar37 != uVar29);
                              }
                              lVar21 = lVar30 - local_438.begin.x;
                              local_438.p[lVar28 + lVar36 + lVar20 + lVar21] = dVar38;
                              if (local_3dc == Inhomogeneous) {
                                local_438.p[lVar28 + lVar36 + lVar20 + lVar21] =
                                     local_1e0.p
                                     [(lVar19 - local_1e0.begin.y) * local_1e0.jstride +
                                      (local_440 - local_1e0.begin.z) * local_1e0.kstride +
                                      local_1e0.nstride * local_300 + (lVar30 - local_1e0.begin.x)]
                                     * local_2e8[0] + dVar38;
                              }
                            }
                            lVar30 = lVar30 + 1;
                          } while (local_3a4 != (int)lVar30);
                        }
                        local_440 = local_440 + 1;
                      } while (local_3e4 != (int)local_440);
                    }
                  }
                  else if (iVar2 == 0x66) {
                    if (iVar12 <= iVar33) {
                      lVar36 = (long)local_3a0.p +
                               (lVar27 - local_3a0.begin.z) * local_3a0.kstride * 4 +
                               (long)(iVar10 - local_3a0.begin.y) *
                               CONCAT44(local_3a0.jstride._4_4_,(uint)local_3a0.jstride) * 4 +
                               (long)local_3a0.begin.x * -4 + local_2a8;
                      lVar30 = lVar27;
                      do {
                        if (iVar26 <= iVar4) {
                          lVar28 = (lVar30 - local_438.begin.z) * local_438.kstride;
                          lVar20 = 0;
                          do {
                            if (0 < *(int *)(lVar36 + lVar20 * 4)) {
                              *(undefined8 *)
                               ((long)local_438.p +
                               lVar20 * 8 +
                               local_438.jstride * 8 * (long)(iVar10 - local_438.begin.y) +
                               lVar28 * 8 + local_438.nstride * local_3f8 +
                               (long)local_438.begin.x * -8 + local_288) =
                                   *(undefined8 *)
                                    ((long)local_438.p +
                                    lVar20 * 8 +
                                    (long)(~local_438.begin.y + iVar10) * local_438.jstride * 8 +
                                    lVar28 * 8 + local_438.nstride * local_3f8 +
                                    (long)local_438.begin.x * -8 + local_288);
                            }
                            lVar20 = lVar20 + 1;
                          } while ((int)local_260 != (int)lVar20);
                        }
                        lVar30 = lVar30 + 1;
                        lVar36 = lVar36 + local_3a0.kstride * 4;
                      } while (local_3e4 != (int)lVar30);
                    }
                  }
                  else if ((iVar2 == 0x67) && (iVar12 <= iVar33)) {
                    lVar36 = (long)local_3a0.p +
                             (lVar27 - local_3a0.begin.z) * local_3a0.kstride * 4 +
                             (long)(iVar10 - local_3a0.begin.y) *
                             CONCAT44(local_3a0.jstride._4_4_,(uint)local_3a0.jstride) * 4 +
                             (long)local_3a0.begin.x * -4 + local_2a8;
                    lVar30 = lVar27;
                    do {
                      if (iVar26 <= iVar4) {
                        lVar28 = (lVar30 - local_438.begin.z) * local_438.kstride;
                        lVar20 = 0;
                        do {
                          if (0 < *(int *)(lVar36 + lVar20 * 4)) {
                            *(ulong *)((long)local_438.p +
                                      lVar20 * 8 +
                                      local_438.jstride * 8 * (long)(iVar10 - local_438.begin.y) +
                                      lVar28 * 8 + local_438.nstride * local_3f8 +
                                      (long)local_438.begin.x * -8 + local_288) =
                                 *(ulong *)((long)local_438.p +
                                           lVar20 * 8 +
                                           (long)(~local_438.begin.y + iVar10) *
                                           local_438.jstride * 8 + lVar28 * 8 +
                                           local_438.nstride * local_3f8 +
                                           (long)local_438.begin.x * -8 + local_288) ^
                                 0x8000000000000000;
                          }
                          lVar20 = lVar20 + 1;
                        } while ((int)local_260 != (int)lVar20);
                      }
                      lVar30 = lVar30 + 1;
                      lVar36 = lVar36 + local_3a0.kstride * 4;
                    } while (local_3e4 != (int)lVar30);
                  }
                }
                else if ((int)uVar32 == 0) {
                  if (iVar18 == 0x65) {
                    local_2e8[4] = -dVar38 * dVar15;
                    local_2e8[5] = 0.5;
                    local_2e8[6] = 1.5;
                    local_2e8[7] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar16) {
                      uVar25 = 0;
                      do {
                        uVar32 = 0;
                        dVar38 = dVar7;
                        dVar40 = dVar8;
                        do {
                          if (uVar25 != uVar32) {
                            dVar38 = dVar38 * (-0.5 - local_2e8[uVar32 + 4]);
                            dVar40 = dVar40 * (local_2e8[uVar25 + 4] - local_2e8[uVar32 + 4]);
                          }
                          uVar32 = uVar32 + 1;
                        } while (uVar37 != uVar32);
                        local_2e8[uVar25] = dVar38 / dVar40;
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar37);
                    }
                    uVar32 = local_290;
                    uVar25 = local_298;
                    if (iVar11 <= iVar3) {
                      local_200 = (int *)local_360.kstride;
                      local_f0 = (long)local_360.begin.z;
                      local_3d8 = local_360.p + (local_3c8 - local_360.begin.x);
                      lVar30 = lVar24;
                      do {
                        if (iVar9 <= iVar5) {
                          lVar28 = (lVar30 - local_438.begin.z) * local_438.kstride;
                          lVar20 = local_438.nstride * local_300;
                          local_3d0 = (int *)(long)local_250.begin.y;
                          lVar36 = lVar23;
                          do {
                            if (0 < local_3d8[(lVar30 - local_360.begin.z) * local_360.kstride +
                                              (lVar36 - local_360.begin.y) *
                                              CONCAT44(local_360.jstride._4_4_,
                                                       (int)local_360.jstride)]) {
                              dVar38 = 0.0;
                              if (1 < (int)uVar16) {
                                uVar29 = 1;
                                do {
                                  dVar38 = dVar38 + local_438.p
                                                    [lVar28 + lVar20 + (lVar36 - local_438.begin.y)
                                                                       * local_438.jstride +
                                                                       (long)((iVar17 - local_438.
                                                                                        begin.x) +
                                                                             (int)uVar29)] *
                                                    local_2e8[uVar29];
                                  uVar29 = uVar29 + 1;
                                } while (uVar37 != uVar29);
                              }
                              lVar21 = (lVar36 - local_438.begin.y) * local_438.jstride;
                              local_438.p
                              [lVar28 + lVar20 + (local_3c8 - local_438.begin.x) + lVar21] = dVar38;
                              if (local_3dc == Inhomogeneous) {
                                local_438.p
                                [lVar28 + lVar20 + (local_3c8 - local_438.begin.x) + lVar21] =
                                     local_250.p
                                     [(local_3c8 - local_250.begin.x) +
                                      (lVar30 - local_250.begin.z) * local_250.kstride +
                                      local_250.nstride * local_300 +
                                      (lVar36 - (long)local_3d0) * local_250.jstride] * local_2e8[0]
                                     + dVar38;
                              }
                            }
                            lVar36 = lVar36 + 1;
                          } while (local_3a8 != (int)lVar36);
                        }
                        lVar30 = lVar30 + 1;
                      } while (local_3e0 != (int)lVar30);
                    }
                  }
                  else if (iVar18 == 0x66) {
                    if (iVar11 <= iVar3) {
                      piVar34 = (int *)((long)local_360.p +
                                       (lVar24 - local_360.begin.z) * local_360.kstride * 4 +
                                       (lVar23 - local_360.begin.y) *
                                       CONCAT44(local_360.jstride._4_4_,(int)local_360.jstride) * 4
                                       + (long)local_360.begin.x * -4 + local_2a0);
                      lVar30 = lVar24;
                      do {
                        if (iVar9 <= iVar5) {
                          lVar36 = local_438.nstride * local_3f8 +
                                   (lVar23 - local_438.begin.y) * local_438.jstride * 8 +
                                   (lVar30 - local_438.begin.z) * local_438.kstride * 8 +
                                   (long)local_438.p;
                          piVar31 = piVar34;
                          iVar18 = local_26c;
                          do {
                            if (0 < *piVar31) {
                              *(undefined8 *)(lVar36 + local_280 + (long)local_438.begin.x * -8) =
                                   *(undefined8 *)
                                    (lVar36 + (long)(local_1e8 - local_438.begin.x) * 8);
                            }
                            lVar36 = lVar36 + local_438.jstride * 8;
                            piVar31 = piVar31 + CONCAT44(local_360.jstride._4_4_,
                                                         (int)local_360.jstride);
                            iVar18 = iVar18 + -1;
                          } while (iVar18 != 0);
                        }
                        lVar30 = lVar30 + 1;
                        piVar34 = piVar34 + local_360.kstride;
                      } while (local_3e0 != (int)lVar30);
                    }
                  }
                  else if ((iVar18 == 0x67) && (iVar11 <= iVar3)) {
                    piVar34 = (int *)((long)local_360.p +
                                     (lVar24 - local_360.begin.z) * local_360.kstride * 4 +
                                     (lVar23 - local_360.begin.y) *
                                     CONCAT44(local_360.jstride._4_4_,(int)local_360.jstride) * 4 +
                                     (long)local_360.begin.x * -4 + local_2a0);
                    lVar30 = lVar24;
                    do {
                      if (iVar9 <= iVar5) {
                        lVar36 = local_438.nstride * local_3f8 +
                                 (lVar23 - local_438.begin.y) * local_438.jstride * 8 +
                                 (lVar30 - local_438.begin.z) * local_438.kstride * 8 +
                                 (long)local_438.p;
                        piVar31 = piVar34;
                        iVar18 = local_26c;
                        do {
                          if (0 < *piVar31) {
                            *(ulong *)(lVar36 + local_280 + (long)local_438.begin.x * -8) =
                                 *(ulong *)(lVar36 + (long)(local_1e4 - local_438.begin.x) * 8) ^
                                 0x8000000000000000;
                          }
                          lVar36 = lVar36 + local_438.jstride * 8;
                          piVar31 = piVar31 + CONCAT44(local_360.jstride._4_4_,
                                                       (int)local_360.jstride);
                          iVar18 = iVar18 + -1;
                        } while (iVar18 != 0);
                      }
                      lVar30 = lVar30 + 1;
                      piVar34 = piVar34 + local_360.kstride;
                    } while (local_3e0 != (int)lVar30);
                  }
                  if (iVar2 == 0x65) {
                    local_2e8[4] = -dVar39 * dVar15;
                    local_2e8[5] = 0.5;
                    local_2e8[6] = 1.5;
                    local_2e8[7] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar16) {
                      uVar25 = 0;
                      do {
                        uVar32 = 0;
                        dVar38 = dVar7;
                        dVar39 = dVar8;
                        do {
                          if (uVar25 != uVar32) {
                            dVar38 = dVar38 * (-0.5 - local_2e8[uVar32 + 4]);
                            dVar39 = dVar39 * (local_2e8[uVar25 + 4] - local_2e8[uVar32 + 4]);
                          }
                          uVar32 = uVar32 + 1;
                        } while (uVar37 != uVar32);
                        local_2e8[uVar25] = dVar38 / dVar39;
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar37);
                    }
                    uVar32 = local_290;
                    uVar25 = local_298;
                    if (iVar12 <= iVar33) {
                      local_3d8 = (int *)local_3a0.kstride;
                      local_200 = (int *)(long)local_3a0.begin.z;
                      local_3b8 = local_3a0.p + (local_3f0 - local_3a0.begin.x);
                      lVar30 = lVar27;
                      do {
                        if (iVar10 <= iVar6) {
                          lVar28 = (lVar30 - local_438.begin.z) * local_438.kstride;
                          lVar20 = local_438.nstride * local_300;
                          local_3d0 = (int *)(long)local_1e0.begin.y;
                          lVar36 = lVar19;
                          do {
                            if (0 < local_3b8[(lVar30 - local_3a0.begin.z) * local_3a0.kstride +
                                              (lVar36 - local_3a0.begin.y) *
                                              CONCAT44(local_3a0.jstride._4_4_,
                                                       (uint)local_3a0.jstride)]) {
                              dVar38 = 0.0;
                              if (1 < (int)uVar16) {
                                uVar29 = 1;
                                iVar18 = local_1f0 - local_438.begin.x;
                                do {
                                  dVar38 = dVar38 + local_438.p
                                                    [lVar28 + lVar20 + (lVar36 - local_438.begin.y)
                                                                       * local_438.jstride +
                                                                       (long)iVar18] *
                                                    local_2e8[uVar29];
                                  uVar29 = uVar29 + 1;
                                  iVar18 = iVar18 + -1;
                                } while (uVar37 != uVar29);
                              }
                              lVar21 = (lVar36 - local_438.begin.y) * local_438.jstride;
                              local_438.p
                              [lVar28 + lVar20 + (local_3f0 - local_438.begin.x) + lVar21] = dVar38;
                              if (local_3dc == Inhomogeneous) {
                                local_438.p
                                [lVar28 + lVar20 + (local_3f0 - local_438.begin.x) + lVar21] =
                                     local_1e0.p
                                     [(local_3f0 - local_1e0.begin.x) +
                                      (lVar30 - local_1e0.begin.z) * local_1e0.kstride +
                                      local_1e0.nstride * local_300 +
                                      (lVar36 - (long)local_3d0) * local_1e0.jstride] * local_2e8[0]
                                     + dVar38;
                              }
                            }
                            lVar36 = lVar36 + 1;
                          } while (local_3ac != (int)lVar36);
                        }
                        lVar30 = lVar30 + 1;
                      } while (local_3e4 != (int)lVar30);
                    }
                  }
                  else if (iVar2 == 0x66) {
                    if (iVar12 <= iVar33) {
                      piVar34 = (int *)((long)local_3a0.p +
                                       (lVar27 - local_3a0.begin.z) * local_3a0.kstride * 4 +
                                       (lVar19 - local_3a0.begin.y) *
                                       CONCAT44(local_3a0.jstride._4_4_,(uint)local_3a0.jstride) * 4
                                       + (long)local_3a0.begin.x * -4 + local_2a8);
                      lVar30 = lVar27;
                      do {
                        if (iVar10 <= iVar6) {
                          lVar36 = local_438.nstride * local_3f8 +
                                   (lVar19 - local_438.begin.y) * local_438.jstride * 8 +
                                   (lVar30 - local_438.begin.z) * local_438.kstride * 8 +
                                   (long)local_438.p;
                          piVar31 = piVar34;
                          iVar18 = local_270;
                          do {
                            if (0 < *piVar31) {
                              *(undefined8 *)(lVar36 + local_288 + (long)local_438.begin.x * -8) =
                                   *(undefined8 *)(lVar36 + (long)(~local_438.begin.x + iVar26) * 8)
                              ;
                            }
                            lVar36 = lVar36 + local_438.jstride * 8;
                            piVar31 = piVar31 + CONCAT44(local_3a0.jstride._4_4_,
                                                         (uint)local_3a0.jstride);
                            iVar18 = iVar18 + -1;
                          } while (iVar18 != 0);
                        }
                        lVar30 = lVar30 + 1;
                        piVar34 = piVar34 + local_3a0.kstride;
                      } while (local_3e4 != (int)lVar30);
                    }
                  }
                  else if ((iVar2 == 0x67) && (iVar12 <= iVar33)) {
                    piVar34 = (int *)((long)local_3a0.p +
                                     (lVar27 - local_3a0.begin.z) * local_3a0.kstride * 4 +
                                     (lVar19 - local_3a0.begin.y) *
                                     CONCAT44(local_3a0.jstride._4_4_,(uint)local_3a0.jstride) * 4 +
                                     (long)local_3a0.begin.x * -4 + local_2a8);
                    lVar30 = lVar27;
                    do {
                      if (iVar10 <= iVar6) {
                        lVar36 = local_438.nstride * local_3f8 +
                                 (lVar19 - local_438.begin.y) * local_438.jstride * 8 +
                                 (lVar30 - local_438.begin.z) * local_438.kstride * 8 +
                                 (long)local_438.p;
                        piVar31 = piVar34;
                        iVar18 = local_270;
                        do {
                          if (0 < *piVar31) {
                            *(ulong *)(lVar36 + local_288 + (long)local_438.begin.x * -8) =
                                 *(ulong *)(lVar36 + (long)(~local_438.begin.x + iVar26) * 8) ^
                                 0x8000000000000000;
                          }
                          lVar36 = lVar36 + local_438.jstride * 8;
                          piVar31 = piVar31 + CONCAT44(local_3a0.jstride._4_4_,
                                                       (uint)local_3a0.jstride);
                          iVar18 = iVar18 + -1;
                        } while (iVar18 != 0);
                      }
                      lVar30 = lVar30 + 1;
                      piVar34 = piVar34 + local_3a0.kstride;
                    } while (local_3e4 != (int)lVar30);
                  }
                }
                else {
                  if (iVar18 == 0x65) {
                    local_2e8[4] = -dVar38 * dVar13;
                    local_2e8[5] = 0.5;
                    local_2e8[6] = 1.5;
                    local_2e8[7] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar16) {
                      uVar25 = 0;
                      do {
                        uVar32 = 0;
                        dVar38 = dVar7;
                        dVar40 = dVar8;
                        do {
                          if (uVar25 != uVar32) {
                            dVar38 = dVar38 * (-0.5 - local_2e8[uVar32 + 4]);
                            dVar40 = dVar40 * (local_2e8[uVar25 + 4] - local_2e8[uVar32 + 4]);
                          }
                          uVar32 = uVar32 + 1;
                        } while (uVar37 != uVar32);
                        local_2e8[uVar25] = dVar38 / dVar40;
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar37);
                    }
                    uVar32 = local_290;
                    uVar25 = local_298;
                    if (iVar9 <= iVar5) {
                      local_3d0 = (int *)CONCAT44(local_360.jstride._4_4_,(int)local_360.jstride);
                      local_3d8 = local_360.p + (lVar24 - local_360.begin.z) * local_360.kstride;
                      lVar30 = lVar23;
                      do {
                        if (iVar17 <= iVar1) {
                          lVar21 = (lVar30 - local_438.begin.y) * local_438.jstride;
                          lVar20 = local_438.nstride * local_300;
                          lVar28 = (lVar24 - local_438.begin.z) * local_438.kstride;
                          lVar36 = local_3c8;
                          do {
                            if (0 < local_3d8[(lVar30 - local_360.begin.y) * (long)local_3d0 +
                                              (lVar36 - local_360.begin.x)]) {
                              dVar38 = 0.0;
                              if (1 < (int)uVar16) {
                                uVar29 = 1;
                                do {
                                  dVar38 = dVar38 + local_438.p
                                                    [lVar21 + lVar20 + (lVar36 - local_438.begin.x)
                                                                       + ((iVar11 - local_438.begin.
                                                                                    z) + (int)uVar29
                                                                         ) * local_438.kstride] *
                                                    local_2e8[uVar29];
                                  uVar29 = uVar29 + 1;
                                } while (uVar37 != uVar29);
                              }
                              lVar22 = lVar36 - local_438.begin.x;
                              local_438.p[lVar21 + lVar20 + lVar28 + lVar22] = dVar38;
                              if (local_3dc == Inhomogeneous) {
                                local_438.p[lVar21 + lVar20 + lVar28 + lVar22] =
                                     local_250.p
                                     [(lVar30 - local_250.begin.y) * local_250.jstride +
                                      (lVar24 - local_250.begin.z) * local_250.kstride +
                                      local_250.nstride * local_300 + (lVar36 - local_250.begin.x)]
                                     * local_2e8[0] + dVar38;
                              }
                            }
                            lVar36 = lVar36 + 1;
                          } while (local_3bc != (int)lVar36);
                        }
                        lVar30 = lVar30 + 1;
                      } while (local_3a8 != (int)lVar30);
                    }
                  }
                  else if (iVar18 == 0x66) {
                    if (iVar9 <= iVar5) {
                      lVar36 = CONCAT44(local_360.jstride._4_4_,(int)local_360.jstride) * 4;
                      lVar20 = (long)local_360.p +
                               (lVar23 - local_360.begin.y) * lVar36 +
                               (iVar11 - local_360.begin.z) * local_360.kstride * 4 +
                               (long)local_360.begin.x * -4 + local_2a0;
                      lVar30 = lVar23;
                      do {
                        if (iVar17 <= iVar1) {
                          lVar28 = (lVar30 - local_438.begin.y) * local_438.jstride;
                          lVar21 = 0;
                          do {
                            if (0 < *(int *)(lVar20 + lVar21 * 4)) {
                              *(undefined8 *)
                               ((long)local_438.p +
                               lVar21 * 8 +
                               (long)(iVar11 - local_438.begin.z) * local_438.kstride * 8 +
                               lVar28 * 8 + local_438.nstride * local_3f8 +
                               (long)local_438.begin.x * -8 + local_280) =
                                   *(undefined8 *)
                                    ((long)local_438.p +
                                    lVar21 * 8 +
                                    local_438.kstride * 8 * (long)(local_268 - local_438.begin.z) +
                                    lVar28 * 8 + local_438.nstride * local_3f8 +
                                    (long)local_438.begin.x * -8 + local_280);
                            }
                            lVar21 = lVar21 + 1;
                          } while (iVar35 != (int)lVar21);
                        }
                        lVar30 = lVar30 + 1;
                        lVar20 = lVar20 + lVar36;
                      } while (local_3a8 != (int)lVar30);
                    }
                  }
                  else if ((iVar18 == 0x67) && (iVar9 <= iVar5)) {
                    lVar36 = CONCAT44(local_360.jstride._4_4_,(int)local_360.jstride) * 4;
                    lVar20 = (long)local_360.p +
                             (lVar23 - local_360.begin.y) * lVar36 +
                             (iVar11 - local_360.begin.z) * local_360.kstride * 4 +
                             (long)local_360.begin.x * -4 + local_2a0;
                    lVar30 = lVar23;
                    do {
                      if (iVar17 <= iVar1) {
                        lVar28 = (lVar30 - local_438.begin.y) * local_438.jstride;
                        lVar21 = 0;
                        do {
                          if (0 < *(int *)(lVar20 + lVar21 * 4)) {
                            *(ulong *)((long)local_438.p +
                                      lVar21 * 8 +
                                      (long)(iVar11 - local_438.begin.z) * local_438.kstride * 8 +
                                      lVar28 * 8 + local_438.nstride * local_3f8 +
                                      (long)local_438.begin.x * -8 + local_280) =
                                 *(ulong *)((long)local_438.p +
                                           lVar21 * 8 +
                                           local_438.kstride * 8 *
                                           (long)(local_268 - local_438.begin.z) + lVar28 * 8 +
                                           local_438.nstride * local_3f8 +
                                           (long)local_438.begin.x * -8 + local_280) ^
                                 0x8000000000000000;
                          }
                          lVar21 = lVar21 + 1;
                        } while (iVar35 != (int)lVar21);
                      }
                      lVar30 = lVar30 + 1;
                      lVar20 = lVar20 + lVar36;
                    } while (local_3a8 != (int)lVar30);
                  }
                  if (iVar2 == 0x65) {
                    local_2e8[4] = -dVar39 * dVar13;
                    local_2e8[5] = 0.5;
                    local_2e8[6] = 1.5;
                    local_2e8[7] = 2.5;
                    local_2e8[2] = 0.0;
                    local_2e8[3] = 0.0;
                    local_2e8[0] = 0.0;
                    local_2e8[1] = 0.0;
                    if (0 < (int)uVar16) {
                      uVar25 = 0;
                      do {
                        uVar32 = 0;
                        dVar38 = dVar7;
                        dVar39 = dVar8;
                        do {
                          if (uVar25 != uVar32) {
                            dVar38 = dVar38 * (-0.5 - local_2e8[uVar32 + 4]);
                            dVar39 = dVar39 * (local_2e8[uVar25 + 4] - local_2e8[uVar32 + 4]);
                          }
                          uVar32 = uVar32 + 1;
                        } while (uVar37 != uVar32);
                        local_2e8[uVar25] = dVar38 / dVar39;
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar37);
                    }
                    uVar32 = local_290;
                    uVar25 = local_298;
                    if (iVar10 <= iVar6) {
                      local_3d0 = (int *)(long)local_3a0.begin.y;
                      local_3b8 = (int *)CONCAT44(local_3a0.jstride._4_4_,(uint)local_3a0.jstride);
                      local_3d8 = local_3a0.p + (lVar27 - local_3a0.begin.z) * local_3a0.kstride;
                      local_440 = lVar19;
                      do {
                        if (iVar26 <= iVar4) {
                          lVar28 = (local_440 - local_438.begin.y) * local_438.jstride;
                          lVar36 = local_438.nstride * local_300;
                          lVar20 = (lVar27 - local_438.begin.z) * local_438.kstride;
                          lVar30 = local_3f0;
                          do {
                            if (0 < local_3d8[(local_440 - (long)local_3d0) * (long)local_3b8 +
                                              (lVar30 - local_3a0.begin.x)]) {
                              dVar38 = 0.0;
                              if (1 < (int)uVar16) {
                                uVar29 = 1;
                                iVar18 = local_1f4 - local_438.begin.z;
                                do {
                                  dVar38 = dVar38 + local_438.p
                                                    [lVar28 + lVar36 + (lVar30 - local_438.begin.x)
                                                                       + local_438.kstride * iVar18]
                                                    * local_2e8[uVar29];
                                  uVar29 = uVar29 + 1;
                                  iVar18 = iVar18 + -1;
                                } while (uVar37 != uVar29);
                              }
                              lVar21 = lVar30 - local_438.begin.x;
                              local_438.p[lVar28 + lVar36 + lVar20 + lVar21] = dVar38;
                              if (local_3dc == Inhomogeneous) {
                                local_438.p[lVar28 + lVar36 + lVar20 + lVar21] =
                                     local_1e0.p
                                     [(local_440 - local_1e0.begin.y) * local_1e0.jstride +
                                      (lVar27 - local_1e0.begin.z) * local_1e0.kstride +
                                      local_1e0.nstride * local_300 + (lVar30 - local_1e0.begin.x)]
                                     * local_2e8[0] + dVar38;
                              }
                            }
                            lVar30 = lVar30 + 1;
                          } while (local_3a4 != (int)lVar30);
                        }
                        local_440 = local_440 + 1;
                      } while (local_3ac != (int)local_440);
                    }
                  }
                  else if (iVar2 == 0x66) {
                    if (iVar10 <= iVar6) {
                      lVar36 = CONCAT44(local_3a0.jstride._4_4_,(uint)local_3a0.jstride) * 4;
                      lVar20 = (long)local_3a0.p +
                               (lVar19 - local_3a0.begin.y) * lVar36 +
                               (iVar12 - local_3a0.begin.z) * local_3a0.kstride * 4 +
                               (long)local_3a0.begin.x * -4 + local_2a8;
                      lVar30 = lVar19;
                      do {
                        if (iVar26 <= iVar4) {
                          lVar28 = (lVar30 - local_438.begin.y) * local_438.jstride;
                          lVar21 = 0;
                          do {
                            if (0 < *(int *)(lVar20 + lVar21 * 4)) {
                              *(undefined8 *)
                               ((long)local_438.p +
                               lVar21 * 8 +
                               (long)(iVar12 - local_438.begin.z) * local_438.kstride * 8 +
                               lVar28 * 8 + local_438.nstride * local_3f8 +
                               (long)local_438.begin.x * -8 + local_288) =
                                   *(undefined8 *)
                                    ((long)local_438.p +
                                    lVar21 * 8 +
                                    local_438.kstride * 8 * (long)(~local_438.begin.z + iVar12) +
                                    lVar28 * 8 + local_438.nstride * local_3f8 +
                                    (long)local_438.begin.x * -8 + local_288);
                            }
                            lVar21 = lVar21 + 1;
                          } while ((int)local_260 != (int)lVar21);
                        }
                        lVar30 = lVar30 + 1;
                        lVar20 = lVar20 + lVar36;
                      } while (local_3ac != (int)lVar30);
                    }
                  }
                  else if ((iVar2 == 0x67) && (iVar10 <= iVar6)) {
                    lVar36 = CONCAT44(local_3a0.jstride._4_4_,(uint)local_3a0.jstride) * 4;
                    lVar20 = (long)local_3a0.p +
                             (lVar19 - local_3a0.begin.y) * lVar36 +
                             (iVar12 - local_3a0.begin.z) * local_3a0.kstride * 4 +
                             (long)local_3a0.begin.x * -4 + local_2a8;
                    lVar30 = lVar19;
                    do {
                      if (iVar26 <= iVar4) {
                        lVar28 = (lVar30 - local_438.begin.y) * local_438.jstride;
                        lVar21 = 0;
                        do {
                          if (0 < *(int *)(lVar20 + lVar21 * 4)) {
                            *(ulong *)((long)local_438.p +
                                      lVar21 * 8 +
                                      (long)(iVar12 - local_438.begin.z) * local_438.kstride * 8 +
                                      lVar28 * 8 + local_438.nstride * local_3f8 +
                                      (long)local_438.begin.x * -8 + local_288) =
                                 *(ulong *)((long)local_438.p +
                                           lVar21 * 8 +
                                           local_438.kstride * 8 *
                                           (long)(~local_438.begin.z + iVar12) + lVar28 * 8 +
                                           local_438.nstride * local_3f8 +
                                           (long)local_438.begin.x * -8 + local_288) ^
                                 0x8000000000000000;
                          }
                          lVar21 = lVar21 + 1;
                        } while ((int)local_260 != (int)lVar21);
                      }
                      lVar30 = lVar30 + 1;
                      lVar20 = lVar20 + lVar36;
                    } while (local_3ac != (int)lVar30);
                  }
                }
                local_3f8 = local_3f8 + 8;
                uVar29 = local_300 + 1;
              } while (local_300 + 1 != uVar25);
            }
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != 3);
        MFIter::operator++(&local_d8);
      } while (local_d8.currentIndex < local_d8.endIndex);
    }
    MFIter::~MFIter(&local_d8);
  }
  else {
    Abort_host("amrex_mllinop_apply_bc not available when BL_NO_FORT=TRUE");
  }
  local_78._vptr_BaseFab = (_func_int **)&PTR__BaseFab_00837b90;
  BaseFab<double>::clear(&local_78);
  return;
}

Assistant:

void
MLCellLinOp::applyBC (int amrlev, int mglev, MultiFab& in, BCMode bc_mode, StateMode,
                      const MLMGBndry* bndry, bool skip_fillboundary) const
{
    BL_PROFILE("MLCellLinOp::applyBC()");
    // No coarsened boundary values, cannot apply inhomog at mglev>0.
    BL_ASSERT(mglev == 0 || bc_mode == BCMode::Homogeneous);
    BL_ASSERT(bndry != nullptr || bc_mode == BCMode::Homogeneous);

    const int ncomp = getNComp();
    const int cross = isCrossStencil();
    const int tensorop = isTensorOp();
    if (!skip_fillboundary) {
        in.FillBoundary(0, ncomp, m_geom[amrlev][mglev].periodicity(),cross);
    }

    int flagbc = bc_mode == BCMode::Inhomogeneous;
    const int imaxorder = maxorder;

    const Real* dxinv = m_geom[amrlev][mglev].InvCellSize();
    const Real dxi = dxinv[0];
    const Real dyi = (AMREX_SPACEDIM >= 2) ? dxinv[1] : Real(1.0);
    const Real dzi = (AMREX_SPACEDIM == 3) ? dxinv[2] : Real(1.0);

    const auto& maskvals = m_maskvals[amrlev][mglev];
    const auto& bcondloc = *m_bcondloc[amrlev][mglev];

    FArrayBox foofab(Box::TheUnitBox(),ncomp);
    const auto& foo = foofab.const_array();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(cross || tensorop || Gpu::notInLaunchRegion(),
                                     "non-cross stencil not support for gpu");

    const int hidden_direction = hiddenDirection();

#ifdef AMREX_USE_GPU
    if ((cross || tensorop) && Gpu::inLaunchRegion())
    {
        Vector<ABCTag> tags;
        tags.reserve(in.local_size()*AMREX_SPACEDIM*ncomp);

        for (MFIter mfi(in); mfi.isValid(); ++mfi) {
            const Box& vbx = mfi.validbox();
            const auto& iofab = in.array(mfi);
            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (idim != hidden_direction) {
                    const Orientation olo(idim,Orientation::low);
                    const Orientation ohi(idim,Orientation::high);
                    const auto& bvlo = (bndry != nullptr) ?
                        bndry->bndryValues(olo).const_array(mfi) : foo;
                    const auto& bvhi = (bndry != nullptr) ?
                        bndry->bndryValues(ohi).const_array(mfi) : foo;
                    for (int icomp = 0; icomp < ncomp; ++icomp) {
                        tags.emplace_back(ABCTag{iofab, bvlo, bvhi,
                                                 maskvals[olo].const_array(mfi),
                                                 maskvals[ohi].const_array(mfi),
                                                 bdlv[icomp][olo], bdlv[icomp][ohi],
                                                 amrex::adjCell(vbx,olo),
                                                 bdcv[icomp][olo], bdcv[icomp][ohi],
                                                 vbx.length(idim), icomp, idim});
                    }
                }
            }
        }

        ParallelFor(tags,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, ABCTag const& tag) noexcept
        {
            if (tag.dir == 0)
            {
                mllinop_apply_bc_x(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dxi, flagbc, tag.comp);
                mllinop_apply_bc_x(1, i+tag.blen+1, j, k, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dxi, flagbc, tag.comp);
            }
#if (AMREX_SPACEDIM > 1)
            else
#if (AMREX_SPACEDIM > 2)
            if (tag.dir == 1)
#endif
            {
                mllinop_apply_bc_y(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dyi, flagbc, tag.comp);
                mllinop_apply_bc_y(1, i, j+tag.blen+1, k, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dyi, flagbc, tag.comp);
            }
#if (AMREX_SPACEDIM > 2)
            else {
                mllinop_apply_bc_z(0, i, j, k, tag.blen, tag.fab,
                                   tag.mask_lo, tag.bctype_lo, tag.bcloc_lo, tag.bcval_lo,
                                   imaxorder, dzi, flagbc, tag.comp);
                mllinop_apply_bc_z(1, i, j, k+tag.blen+1, tag.blen, tag.fab,
                                   tag.mask_hi, tag.bctype_hi, tag.bcloc_hi, tag.bcval_hi,
                                   imaxorder, dzi, flagbc, tag.comp);
            }
#endif
#endif
        });
    } else
#endif
    if (cross || tensorop)
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx   = mfi.validbox();
            const auto& iofab = in.array(mfi);

            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                if (hidden_direction == idim) continue;
                const Orientation olo(idim,Orientation::low);
                const Orientation ohi(idim,Orientation::high);
                const Box blo = amrex::adjCellLo(vbx, idim);
                const Box bhi = amrex::adjCellHi(vbx, idim);
                const int blen = vbx.length(idim);
                const auto& mlo = maskvals[olo].array(mfi);
                const auto& mhi = maskvals[ohi].array(mfi);
                const auto& bvlo = (bndry != nullptr) ? bndry->bndryValues(olo).const_array(mfi) : foo;
                const auto& bvhi = (bndry != nullptr) ? bndry->bndryValues(ohi).const_array(mfi) : foo;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    const BoundCond bctlo = bdcv[icomp][olo];
                    const BoundCond bcthi = bdcv[icomp][ohi];
                    const Real bcllo = bdlv[icomp][olo];
                    const Real bclhi = bdlv[icomp][ohi];
                    if (idim == 0) {
                        mllinop_apply_bc_x(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dxi, flagbc, icomp);
                        mllinop_apply_bc_x(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dxi, flagbc, icomp);
                    } else if (idim == 1) {
                        mllinop_apply_bc_y(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dyi, flagbc, icomp);
                        mllinop_apply_bc_y(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dyi, flagbc, icomp);
                    } else {
                        mllinop_apply_bc_z(0, blo, blen, iofab, mlo,
                                           bctlo, bcllo, bvlo,
                                           imaxorder, dzi, flagbc, icomp);
                        mllinop_apply_bc_z(1, bhi, blen, iofab, mhi,
                                           bcthi, bclhi, bvhi,
                                           imaxorder, dzi, flagbc, icomp);
                    }
                }
            }
        }
    }
    else
    {
#ifdef BL_NO_FORT
        amrex::Abort("amrex_mllinop_apply_bc not available when BL_NO_FORT=TRUE");
#else
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(in, mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx   = mfi.validbox();

            const auto & bdlv = bcondloc.bndryLocs(mfi);
            const auto & bdcv = bcondloc.bndryConds(mfi);

            const RealTuple & bdl = bdlv[0];
            const BCTuple   & bdc = bdcv[0];

            for (OrientationIter oitr; oitr; ++oitr)
            {
                const Orientation ori = oitr();

                int  cdr = ori;
                Real bcl = bdl[ori];
                int  bct = bdc[ori];

                const FArrayBox& fsfab = (bndry != nullptr) ? bndry->bndryValues(ori)[mfi] : foofab;

                const Mask& m = maskvals[ori][mfi];

                amrex_mllinop_apply_bc(BL_TO_FORTRAN_BOX(vbx),
                                       BL_TO_FORTRAN_ANYD(in[mfi]),
                                       BL_TO_FORTRAN_ANYD(m),
                                       cdr, bct, bcl,
                                       BL_TO_FORTRAN_ANYD(fsfab),
                                       maxorder, dxinv, flagbc, ncomp, cross);
            }
        }
#endif
    }
}